

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint32_t FNV32a_YoshimitsuTRIAD(char *key,int len,uint32_t seed)

{
  uint32_t uVar1;
  uint uVar2;
  uint in_EDX;
  uint in_ESI;
  uint32_t *in_RDI;
  uint32_t hash32C;
  uint32_t hash32B;
  uint32_t hash32A;
  uint32_t PRIME;
  uint8_t *p;
  uint local_28;
  uint local_24;
  uint local_20;
  uint32_t *local_18;
  uint local_c;
  
  local_20 = in_EDX ^ 0x811c9dc5;
  local_24 = in_ESI + 0x811c9dc5;
  local_28 = 0x811c9dc5;
  local_18 = in_RDI;
  for (local_c = in_ESI; 0x17 < local_c; local_c = local_c - 0x18) {
    uVar1 = rotl32(*local_18,'\x05');
    local_20 = (local_20 ^ uVar1 ^ local_18[1]) * 0xad3e7;
    uVar1 = rotl32(local_18[2],'\x05');
    local_24 = (local_24 ^ uVar1 ^ local_18[3]) * 0xad3e7;
    uVar1 = rotl32(local_18[4],'\x05');
    local_28 = (local_28 ^ uVar1 ^ local_18[5]) * 0xad3e7;
    local_18 = local_18 + 6;
  }
  if (local_18 != in_RDI) {
    uVar1 = rotl32(local_28,'\x05');
    local_20 = (local_20 ^ uVar1) * 0xad3e7;
  }
  if ((local_c & 0x10) != 0) {
    uVar1 = rotl32(*local_18,'\x05');
    local_20 = (local_20 ^ uVar1 ^ local_18[1]) * 0xad3e7;
    uVar1 = rotl32(local_18[2],'\x05');
    local_24 = (local_24 ^ uVar1 ^ local_18[3]) * 0xad3e7;
    local_18 = local_18 + 4;
  }
  if ((local_c & 8) != 0) {
    local_20 = (local_20 ^ *local_18) * 0xad3e7;
    local_24 = (local_24 ^ local_18[1]) * 0xad3e7;
    local_18 = local_18 + 2;
  }
  if ((local_c & 4) != 0) {
    local_20 = (local_20 ^ (ushort)*local_18) * 0xad3e7;
    local_24 = (local_24 ^ *(ushort *)((long)local_18 + 2)) * 0xad3e7;
    local_18 = local_18 + 1;
  }
  if ((local_c & 2) != 0) {
    local_20 = (local_20 ^ (ushort)*local_18) * 0xad3e7;
    local_18 = (uint32_t *)((long)local_18 + 2);
  }
  if ((local_c & 1) != 0) {
    local_20 = (local_20 ^ (byte)*local_18) * 0xad3e7;
  }
  uVar1 = rotl32(local_24,'\x05');
  uVar2 = (local_20 ^ uVar1) * 0xad3e7;
  return uVar2 ^ uVar2 >> 0x10;
}

Assistant:

uint32_t
FNV32a_YoshimitsuTRIAD(const char *key, int len, uint32_t seed)
{
  const uint8_t  *p = (const uint8_t *)key;
  const uint32_t  PRIME = 709607;
  uint32_t	  hash32A = seed ^ UINT32_C(2166136261);
  uint32_t	  hash32B = UINT32_C(2166136261) + len;
  uint32_t	  hash32C = UINT32_C(2166136261);

  for (; len >= 3 * 2 * sizeof(uint32_t); len -= 3 * 2 * sizeof(uint32_t), p += 3 * 2 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ (ROTL32(*(uint32_t *) (p + 0), 5)  ^ *(uint32_t *) (p + 4)))  * PRIME;
    hash32B = (hash32B ^ (ROTL32(*(uint32_t *) (p + 8), 5)  ^ *(uint32_t *) (p + 12))) * PRIME;
    hash32C = (hash32C ^ (ROTL32(*(uint32_t *) (p + 16), 5) ^ *(uint32_t *) (p + 20))) * PRIME;
  }
  if (p != (const uint8_t *)key) {
    hash32A = (hash32A ^ ROTL32(hash32C, 5)) * PRIME;
  }
  //Cases 0. .31
  if (len & 4 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ (ROTL32(*(uint32_t *) (p + 0), 5) ^ *(uint32_t *) (p + 4))) * PRIME;
    hash32B = (hash32B ^ (ROTL32(*(uint32_t *) (p + 8), 5) ^ *(uint32_t *) (p + 12))) * PRIME;
    p += 8 * sizeof(uint16_t);
  }
  //Cases 0. .15
  if (len & 2 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ *(uint32_t *) (p + 0)) * PRIME;
    hash32B = (hash32B ^ *(uint32_t *) (p + 4)) * PRIME;
    p += 4 * sizeof(uint16_t);
  }
  //Cases:0. .7
  if (len & sizeof(uint32_t)) {
    hash32A = (hash32A ^ *(uint16_t *) (p + 0)) * PRIME;
    hash32B = (hash32B ^ *(uint16_t *) (p + 2)) * PRIME;
    p += 2 * sizeof(uint16_t);
  }
  //Cases:0. .3
  if (len & sizeof(uint16_t)) {
    hash32A = (hash32A ^ *(uint16_t *) p) * PRIME;
    p += sizeof(uint16_t);
  }
  if (len & 1)
    hash32A = (hash32A ^ *p) * PRIME;

  hash32A = (hash32A ^ ROTL32(hash32B, 5)) * PRIME;
  return hash32A ^ (hash32A >> 16);
}